

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void luaC_checkfinalizer(lua_State *L,GCObject *o,Table *mt)

{
  global_State *pgVar1;
  TValue *pTVar2;
  GCObject *pGVar3;
  GCObject *pGVar4;
  
  if (((mt != (Table *)0x0) && ((o->marked & 0x40) == 0)) && ((mt->flags & 4) == 0)) {
    pgVar1 = L->l_G;
    pTVar2 = luaT_gettm(mt,TM_GC,pgVar1->tmname[2]);
    if ((pTVar2 != (TValue *)0x0) && ((pgVar1->gcstp & 4) == 0)) {
      if ((byte)(pgVar1->gcstate - 3) < 4) {
        o->marked = pgVar1->currentwhite & 0x18 | o->marked & 199;
        pGVar3 = (GCObject *)pgVar1->sweepgc;
        if (pGVar3 == o) {
          do {
            pGVar3 = (GCObject *)sweeplist(L,&pGVar3->next,1);
          } while (pGVar3 == o);
          pgVar1->sweepgc = (GCObject **)pGVar3;
        }
      }
      else {
        if (pgVar1->survival == o) {
          pgVar1->survival = o->next;
        }
        if (pgVar1->old1 == o) {
          pgVar1->old1 = o->next;
        }
        if (pgVar1->reallyold == o) {
          pgVar1->reallyold = o->next;
        }
        if (pgVar1->firstold1 == o) {
          pgVar1->firstold1 = o->next;
        }
      }
      pGVar3 = (GCObject *)&pgVar1->allgc;
      do {
        pGVar4 = pGVar3;
        pGVar3 = pGVar4->next;
      } while (pGVar3 != o);
      pGVar4->next = o->next;
      o->next = pgVar1->finobj;
      pgVar1->finobj = o;
      o->marked = o->marked | 0x40;
    }
  }
  return;
}

Assistant:

void luaC_checkfinalizer (lua_State *L, GCObject *o, Table *mt) {
  global_State *g = G(L);
  if (tofinalize(o) ||                 /* obj. is already marked... */
      gfasttm(g, mt, TM_GC) == NULL ||    /* or has no finalizer... */
      (g->gcstp & GCSTPCLS))                   /* or closing state? */
    return;  /* nothing to be done */
  else {  /* move 'o' to 'finobj' list */
    GCObject **p;
    if (issweepphase(g)) {
      makewhite(g, o);  /* "sweep" object 'o' */
      if (g->sweepgc == &o->next)  /* should not remove 'sweepgc' object */
        g->sweepgc = sweeptolive(L, g->sweepgc);  /* change 'sweepgc' */
    }
    else
      correctpointers(g, o);
    /* search for pointer pointing to 'o' */
    for (p = &g->allgc; *p != o; p = &(*p)->next) { /* empty */ }
    *p = o->next;  /* remove 'o' from 'allgc' list */
    o->next = g->finobj;  /* link it in 'finobj' list */
    g->finobj = o;
    l_setbit(o->marked, FINALIZEDBIT);  /* mark it as such */
  }
}